

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdi::ControllerWidget::paintEvent(ControllerWidget *this,QPaintEvent *param_1)

{
  uint uVar1;
  SubControl SVar2;
  SubControl SVar3;
  QStyle *pQVar4;
  uint uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QPainter painter;
  QStyleOptionComplex opt;
  undefined1 *local_70;
  undefined1 local_68 [16];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QPalettePrivate *pQStack_40;
  undefined1 *local_38;
  QObject *pQStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)local_68,1,0xf0000);
  QStyleOption::initFrom((QStyleOption *)local_68,&this->super_QWidget);
  uVar1 = (this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
          super_QFlagsStorage<QStyle::SubControl>.i;
  local_28 = (undefined1 *)(ulong)uVar1;
  SVar3 = this->activeControl;
  SVar2 = this->hoverControl;
  uVar5 = 4;
  if ((SVar3 == SVar2) ||
     (bVar6 = SVar3 == SC_None, uVar5 = 0x2000, SVar3 = SVar2, bVar6 && SVar2 != SC_None)) {
    local_28 = (undefined1 *)CONCAT44(SVar3,uVar1);
    local_68._8_4_ = local_68._8_4_ | uVar5;
  }
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_70,&(this->super_QWidget).super_QPaintDevice);
  pQVar4 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar4 + 200))(pQVar4,8,(QStyleOption *)local_68,(QPainter *)&local_70,this)
  ;
  QPainter::~QPainter((QPainter *)&local_70);
  QStyleOption::~QStyleOption((QStyleOption *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ControllerWidget::paintEvent(QPaintEvent * /*paintEvent*/)
{
    QStyleOptionComplex opt;
    initStyleOption(&opt);
    if (activeControl == hoverControl) {
        opt.activeSubControls = activeControl;
        opt.state |= QStyle::State_Sunken;
    } else if (hoverControl != QStyle::SC_None && (activeControl == QStyle::SC_None)) {
        opt.activeSubControls = hoverControl;
        opt.state |= QStyle::State_MouseOver;
    }
    QPainter painter(this);
    style()->drawComplexControl(QStyle::CC_MdiControls, &opt, &painter, this);
}